

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void prvTidyDefineMutedMessage(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  tidyStrings tVar1;
  int iVar2;
  tidyStrings *ptVar3;
  uint uVar4;
  uint uVar5;
  tidyStringsKeyItem *ptVar6;
  
  iVar2 = strcmp("TidyDiagnostics",name);
  if (iVar2 == 0) {
    ptVar6 = tidyStringsKeys;
  }
  else {
    uVar4 = 1;
    do {
      uVar5 = uVar4;
      if (tidyStringsKeys[uVar5].key == (char *)0x0) goto LAB_00151598;
      iVar2 = strcmp(tidyStringsKeys[uVar5].key,name);
      uVar4 = uVar5 + 1;
    } while (iVar2 != 0);
    ptVar6 = tidyStringsKeys + uVar5;
  }
  tVar1 = ptVar6->value;
  if (0xffffff8e < tVar1 - REPORT_MESSAGE_LAST) {
    ptVar3 = (doc->muted).list;
    if (ptVar3 == (tidyStrings *)0x0) {
      ptVar3 = (tidyStrings *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x28);
      (doc->muted).list = ptVar3;
      *ptVar3 = 0;
      (doc->muted).count = 0;
      (doc->muted).capacity = 10;
      uVar4 = 0;
    }
    else {
      uVar4 = (doc->muted).count;
      uVar5 = (doc->muted).capacity;
      if (uVar5 <= uVar4) {
        uVar5 = uVar5 * 2;
        (doc->muted).capacity = uVar5;
        ptVar3 = (tidyStrings *)
                 (*doc->allocator->vtbl->realloc)(doc->allocator,ptVar3,(ulong)uVar5 * 4 + 1);
        (doc->muted).list = ptVar3;
        uVar4 = (doc->muted).count;
      }
    }
    ptVar3[uVar4] = tVar1;
    uVar4 = (doc->muted).count + 1;
    (doc->muted).count = uVar4;
    ptVar3[uVar4] = 0;
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27a,name);
    return;
  }
LAB_00151598:
  prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x277,opt->name,name);
  return;
}

Assistant:

void TY_(DefineMutedMessage)(TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name)
{
    enum { capacity = 10 };
    TidyMutedMessages *list = &(doc->muted);
    tidyStrings message = TY_(tidyErrorCodeFromKey)( name );

    if ( message <= REPORT_MESSAGE_FIRST || message >= REPORT_MESSAGE_LAST)
    {
        TY_(Report)( doc, NULL, NULL, STRING_ARGUMENT_BAD, opt->name, name );
        return;
    }

    if ( !list->list )
    {
        list->list = TidyAlloc(doc->allocator, sizeof(tidyStrings) * capacity );
        list->list[0] = 0;
        list->capacity = capacity;
        list->count = 0;
    }

    if ( list->count >= list->capacity )
    {
        list->capacity = list->capacity * 2;
        list->list = TidyRealloc(doc->allocator, list->list, sizeof(tidyStrings) * list->capacity + 1 );
    }

    list->list[list->count] = message;
    list->count++;
    list->list[list->count] = 0;

    /* Must come *after* adding to the list, in case it's muted, too. */
    TY_(Report)( doc, NULL, NULL, STRING_MUTING_TYPE, name );
}